

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O3

void Parser::
     MapBindIdentifierFromElement<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
               (ParseNodePtr elementNode,anon_class_40_5_07c1c418 handler)

{
  FuncInfo *funcInfo;
  code *pcVar1;
  OpCode OVar2;
  bool bVar3;
  ParseNodeBin *pPVar4;
  undefined4 *puVar5;
  DebuggerScope *pDVar6;
  ParseNodeVar *pPVar7;
  DiagExtraScopesType scopeType;
  
  OVar2 = elementNode->nop;
  if (OVar2 == knopEllipsis) {
    pPVar4 = (ParseNodeBin *)ParseNode::AsParseNodeUni(elementNode);
  }
  else {
    if (OVar2 != knopAsg) goto LAB_00817bde;
    pPVar4 = ParseNode::AsParseNodeBin(elementNode);
  }
  elementNode = pPVar4->pnode1;
  OVar2 = elementNode->nop;
LAB_00817bde:
  if ((OVar2 & ~knopInt) == knopObjectPattern) {
    MapBindIdentifier<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
              (elementNode,handler);
    return;
  }
  if (2 < (byte)(OVar2 + ~knopList)) {
    if (OVar2 != knopEmpty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                         ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    return;
  }
  pDVar6 = *handler.debuggerScope;
  if (pDVar6 == (DebuggerScope *)0x0) {
    if ((*handler.funcInfo)->paramScope == (Scope *)0x0) {
      scopeType = DiagParamScope;
    }
    else {
      scopeType = DiagParamScopeInObject - (((*handler.funcInfo)->paramScope->field_0x44 & 2) == 0);
    }
    pDVar6 = ByteCodeGenerator::RecordStartScopeObject
                       (handler.this,&(*handler.pnodeFnc)->super_ParseNode,scopeType,0xffffffff,
                        (int *)0x0);
    *handler.debuggerScope = pDVar6;
    Js::DebuggerScope::SetBegin(pDVar6,*handler.beginOffset);
    pDVar6 = *handler.debuggerScope;
  }
  funcInfo = *handler.funcInfo;
  pPVar7 = ParseNode::AsParseNodeVar(elementNode);
  ByteCodeGenerator::InsertPropertyToDebuggerScope(handler.this,funcInfo,pDVar6,pPVar7->sym);
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }